

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::TextureParameterQueriesTestCase::testVirtualPageSizeIndexARB
          (TextureParameterQueriesTestCase *this,Functions *gl,GLint target,GLint expectedError)

{
  GLint GVar1;
  GLenum GVar2;
  ostream *poVar3;
  GLfloat local_34;
  GLuint local_30;
  GLfloat testValueFloat;
  GLuint testValueUInt;
  GLint testValueInt;
  GLint GStack_20;
  bool result;
  GLint pname;
  GLint expectedError_local;
  GLint target_local;
  Functions *gl_local;
  TextureParameterQueriesTestCase *this_local;
  
  testValueInt = 0x91a7;
  testValueUInt._3_1_ = 1;
  GStack_20 = expectedError;
  pname = target;
  _expectedError_local = gl;
  gl_local = (Functions *)this;
  poVar3 = std::operator<<((ostream *)&this->field_0x88,
                           "Testing VIRTUAL_PAGE_SIZE_INDEX_ARB for target: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,pname);
  std::operator<<(poVar3," - ");
  if (GStack_20 == 0) {
    testValueUInt._3_1_ = checkGetTexParameter(this,_expectedError_local,pname,0x91a7,0);
  }
  if ((testValueUInt._3_1_ & 1) != 0) {
    (*_expectedError_local->texParameteri)(pname,0x91a7,1);
    GVar1 = pname;
    if (GStack_20 == 0) {
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x24f);
      testValueUInt._3_1_ = checkGetTexParameter(this,_expectedError_local,pname,0x91a7,1);
      (*_expectedError_local->texParameteri)(pname,0x91a7,0);
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x254);
    }
    else {
      GVar2 = (*_expectedError_local->getError)();
      testValueUInt._3_1_ =
           SparseTextureUtils::verifyQueryError
                     (&this->mLog,"glTexParameteri",GVar1,0x91a7,GVar2,GStack_20);
    }
  }
  if ((testValueUInt._3_1_ & 1) != 0) {
    (*_expectedError_local->texParameterf)(pname,0x91a7,2.0);
    GVar1 = pname;
    if (GStack_20 == 0) {
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameterf error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x260);
      testValueUInt._3_1_ = checkGetTexParameter(this,_expectedError_local,pname,0x91a7,2);
      (*_expectedError_local->texParameteri)(pname,0x91a7,0);
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x264);
    }
    else {
      GVar2 = (*_expectedError_local->getError)();
      testValueUInt._3_1_ =
           SparseTextureUtils::verifyQueryError
                     (&this->mLog,"glTexParameterf",GVar1,0x91a7,GVar2,GStack_20);
    }
  }
  if ((testValueUInt._3_1_ & 1) != 0) {
    testValueFloat = 1.12104e-44;
    (*_expectedError_local->texParameteriv)(pname,0x91a7,(GLint *)&testValueFloat);
    GVar1 = pname;
    if (GStack_20 == 0) {
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteriv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x271);
      testValueUInt._3_1_ = checkGetTexParameter(this,_expectedError_local,pname,0x91a7,8);
      (*_expectedError_local->texParameteri)(pname,0x91a7,0);
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x275);
    }
    else {
      GVar2 = (*_expectedError_local->getError)();
      testValueUInt._3_1_ =
           SparseTextureUtils::verifyQueryError
                     (&this->mLog,"glTexParameteriv",GVar1,0x91a7,GVar2,GStack_20);
    }
  }
  if ((testValueUInt._3_1_ & 1) != 0) {
    local_34 = 10.0;
    (*_expectedError_local->texParameterfv)(pname,0x91a7,&local_34);
    GVar1 = pname;
    if (GStack_20 == 0) {
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameterfv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x282);
      testValueUInt._3_1_ = checkGetTexParameter(this,_expectedError_local,pname,0x91a7,10);
      (*_expectedError_local->texParameteri)(pname,0x91a7,0);
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x286);
    }
    else {
      GVar2 = (*_expectedError_local->getError)();
      testValueUInt._3_1_ =
           SparseTextureUtils::verifyQueryError
                     (&this->mLog,"glTexParameterfv",GVar1,0x91a7,GVar2,GStack_20);
    }
  }
  if ((testValueUInt._3_1_ & 1) != 0) {
    testValueFloat = 8.40779e-45;
    (*_expectedError_local->texParameterIiv)(pname,0x91a7,(GLint *)&testValueFloat);
    GVar1 = pname;
    if (GStack_20 == 0) {
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameterIiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x293);
      testValueUInt._3_1_ = checkGetTexParameter(this,_expectedError_local,pname,0x91a7,6);
      (*_expectedError_local->texParameteri)(pname,0x91a7,0);
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x297);
    }
    else {
      GVar2 = (*_expectedError_local->getError)();
      testValueUInt._3_1_ =
           SparseTextureUtils::verifyQueryError
                     (&this->mLog,"glTexParameterIiv",GVar1,0x91a7,GVar2,GStack_20);
    }
  }
  if ((testValueUInt._3_1_ & 1) != 0) {
    local_30 = 0x10;
    (*_expectedError_local->texParameterIuiv)(pname,0x91a7,&local_30);
    GVar1 = pname;
    if (GStack_20 == 0) {
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameterIuiv error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x2a4);
      testValueUInt._3_1_ = checkGetTexParameter(this,_expectedError_local,pname,0x91a7,0x10);
      (*_expectedError_local->texParameteri)(pname,0x91a7,0);
      GVar2 = (*_expectedError_local->getError)();
      glu::checkError(GVar2,"glTexParameteri error occurred",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTextureTests.cpp"
                      ,0x2a8);
    }
    else {
      GVar2 = (*_expectedError_local->getError)();
      testValueUInt._3_1_ =
           SparseTextureUtils::verifyQueryError
                     (&this->mLog,"glTexParameterIuiv",GVar1,0x91a7,GVar2,GStack_20);
    }
  }
  return (bool)(testValueUInt._3_1_ & 1);
}

Assistant:

bool TextureParameterQueriesTestCase::testVirtualPageSizeIndexARB(const Functions& gl, GLint target,
																  GLint expectedError)
{
	const GLint pname = GL_VIRTUAL_PAGE_SIZE_INDEX_ARB;

	bool result = true;

	GLint   testValueInt;
	GLuint  testValueUInt;
	GLfloat testValueFloat;

	mLog << "Testing VIRTUAL_PAGE_SIZE_INDEX_ARB for target: " << target << " - ";

	//Check getTexParameter* default value
	if (expectedError == GL_NO_ERROR)
		result = checkGetTexParameter(gl, target, pname, 0);

	//Check getTexParameter* for manually set values
	if (result)
	{
		gl.texParameteri(target, pname, 1);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
			result = checkGetTexParameter(gl, target, pname, 1);

			//If no error verification reset TEXTURE_SPARSE_ARB value
			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteri", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		gl.texParameterf(target, pname, 2.0f);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterf error occurred");
			result = checkGetTexParameter(gl, target, pname, 2);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterf", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueInt = 8;
		gl.texParameteriv(target, pname, &testValueInt);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteriv error occurred");
			result = checkGetTexParameter(gl, target, pname, 8);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameteriv", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueFloat = 10.0f;
		gl.texParameterfv(target, pname, &testValueFloat);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterfv error occurred");
			result = checkGetTexParameter(gl, target, pname, 10);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterfv", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueInt = 6;
		gl.texParameterIiv(target, pname, &testValueInt);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterIiv error occurred");
			result = checkGetTexParameter(gl, target, pname, 6);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIiv", target, pname, gl.getError(),
														  expectedError);
	}

	if (result)
	{
		testValueUInt = 16;
		gl.texParameterIuiv(target, pname, &testValueUInt);
		if (expectedError == GL_NO_ERROR)
		{
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameterIuiv error occurred");
			result = checkGetTexParameter(gl, target, pname, 16);

			gl.texParameteri(target, pname, 0);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri error occurred");
		}
		else
			result = SparseTextureUtils::verifyQueryError(mLog, "glTexParameterIuiv", target, pname, gl.getError(),
														  expectedError);
	}

	return result;
}